

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmElfRelocator.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
ArmElfRelocator::generateCtorStub
          (ArmElfRelocator *this,vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *ctors)

{
  char *__s;
  ulong uVar1;
  size_type sVar2;
  reference fmt;
  reference args;
  reference pvVar3;
  string *psVar4;
  pointer in_RDX;
  unsigned_long *in_R9;
  initializer_list<AssemblyTemplateArgument> variables;
  initializer_list<AssemblyTemplateArgument> variables_00;
  AssemblyTemplateArgument *local_408;
  char *local_3f0;
  bool local_369;
  initializer_list<AssemblyTemplateArgument> local_350;
  allocator<char> local_339;
  undefined1 local_338 [40];
  Identifier local_310;
  Identifier local_2f0;
  Identifier local_2d0;
  unsigned_long local_2b0;
  Identifier local_2a8;
  AssemblyTemplateArgument *local_288;
  AssemblyTemplateArgument local_280;
  char *local_258;
  string local_250;
  char *local_230;
  string local_228 [32];
  char *local_208;
  string local_200 [32];
  char *local_1e0;
  string local_1d8 [32];
  char *local_1b8;
  string asStack_1b0 [32];
  char *local_190;
  string local_188 [32];
  undefined1 local_168 [24];
  undefined1 local_150 [32];
  string local_130;
  ulong local_110;
  size_t i;
  string table;
  undefined1 local_d0 [7];
  bool simpleMode;
  Parser parser;
  vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *ctors_local;
  ArmElfRelocator *this_local;
  
  parser.conditionStack.
  super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RDX;
  Parser::Parser((Parser *)local_d0);
  sVar2 = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::size
                    ((vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *)
                     parser.conditionStack.
                     super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_338,"bx r14",&local_339);
    std::initializer_list<AssemblyTemplateArgument>::initializer_list(&local_350);
    variables_00._M_len = (size_type)local_350._M_array;
    variables_00._M_array = (iterator)local_338;
    Parser::parseTemplate((Parser *)this,(string *)local_d0,variables_00);
    std::__cxx11::string::~string((string *)local_338);
    std::allocator<char>::~allocator(&local_339);
    local_338._32_4_ = 1;
  }
  else {
    local_369 = false;
    if (((ulong)(ctors->super__Vector_base<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>).
                _M_impl.super__Vector_impl_data._M_finish & 1) == 0) {
      local_369 = CArmArchitecture::GetThumbMode(&Arm);
    }
    std::__cxx11::string::string((string *)&i);
    local_110 = 0;
    while( true ) {
      uVar1 = local_110;
      sVar2 = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::size
                        ((vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *)
                         parser.conditionStack.
                         super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __s = ctorTemplate;
      if (sVar2 <= uVar1) break;
      if (local_110 != 0) {
        std::__cxx11::string::operator+=((string *)&i,',');
      }
      fmt = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::operator[]
                      ((vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *)
                       parser.conditionStack.
                       super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
      args = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::operator[]
                       ((vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *)
                        parser.conditionStack.
                        super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
      pvVar3 = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::operator[]
                         ((vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *)
                          parser.conditionStack.
                          super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
      tinyformat::format<Identifier,Identifier,unsigned_long>
                ((string *)(local_150 + 0x20),(tinyformat *)"%s,%s+0x%08X",(char *)fmt,
                 &args->symbolName,(Identifier *)&pvVar3->size,in_R9);
      std::__cxx11::string::operator+=((string *)&i,(string *)(local_150 + 0x20));
      std::__cxx11::string::~string((string *)(local_150 + 0x20));
      local_110 = local_110 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_150,__s,(allocator<char> *)(local_168 + 0x17));
    local_338[0x26] = '\x01';
    local_288 = &local_280;
    local_280.variableName = "%ctorTable%";
    SymbolTable::getUniqueLabelName(&local_2a8,&Global.symbolTable,false);
    psVar4 = Identifier::string_abi_cxx11_(&local_2a8);
    std::__cxx11::string::string((string *)&local_280.value,(string *)psVar4);
    local_288 = (AssemblyTemplateArgument *)&local_258;
    local_258 = "%ctorTableSize%";
    sVar2 = std::vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>::size
                      ((vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *)
                       parser.conditionStack.
                       super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_2b0 = sVar2 << 3;
    tinyformat::format<unsigned_long>(&local_250,"%d",&local_2b0);
    local_288 = (AssemblyTemplateArgument *)&local_230;
    local_230 = "%outerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_2d0,&Global.symbolTable,false);
    psVar4 = Identifier::string_abi_cxx11_(&local_2d0);
    std::__cxx11::string::string(local_228,(string *)psVar4);
    local_288 = (AssemblyTemplateArgument *)&local_208;
    local_208 = "%innerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_2f0,&Global.symbolTable,false);
    psVar4 = Identifier::string_abi_cxx11_(&local_2f0);
    std::__cxx11::string::string(local_200,(string *)psVar4);
    local_288 = (AssemblyTemplateArgument *)&local_1e0;
    local_1e0 = "%stubName%";
    SymbolTable::getUniqueLabelName(&local_310,&Global.symbolTable,false);
    psVar4 = Identifier::string_abi_cxx11_(&local_310);
    std::__cxx11::string::string(local_1d8,(string *)psVar4);
    local_288 = (AssemblyTemplateArgument *)&local_1b8;
    local_1b8 = "%simpleMode%";
    if (local_369 == false) {
      local_3f0 = "0";
    }
    else {
      local_3f0 = "1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (asStack_1b0,local_3f0,(allocator<char> *)(local_338 + 0x27));
    local_288 = (AssemblyTemplateArgument *)&local_190;
    local_190 = "%ctorContent%";
    std::__cxx11::string::string(local_188,(string *)&i);
    local_338[0x26] = '\0';
    local_168._0_8_ = &local_280;
    local_168._8_8_ = 7;
    variables._M_len = local_168._0_8_;
    variables._M_array = (iterator)local_150;
    Parser::parseTemplate((Parser *)this,(string *)local_d0,variables);
    local_408 = (AssemblyTemplateArgument *)local_168;
    do {
      local_408 = local_408 + -1;
      AssemblyTemplateArgument::~AssemblyTemplateArgument(local_408);
    } while (local_408 != &local_280);
    std::allocator<char>::~allocator((allocator<char> *)(local_338 + 0x27));
    Identifier::~Identifier(&local_310);
    Identifier::~Identifier(&local_2f0);
    Identifier::~Identifier(&local_2d0);
    Identifier::~Identifier(&local_2a8);
    std::__cxx11::string::~string((string *)local_150);
    std::allocator<char>::~allocator((allocator<char> *)(local_168 + 0x17));
    local_338._32_4_ = 1;
    std::__cxx11::string::~string((string *)&i);
  }
  Parser::~Parser((Parser *)local_d0);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> ArmElfRelocator::generateCtorStub(std::vector<ElfRelocatorCtor>& ctors)
{
	Parser parser;
	if (ctors.size() != 0)
	{
		bool simpleMode = arm9 == false && Arm.GetThumbMode();

		// create constructor table
		std::string table;
		for (size_t i = 0; i < ctors.size(); i++)
		{
			if (i != 0)
				table += ',';
			table += tfm::format("%s,%s+0x%08X",ctors[i].symbolName,ctors[i].symbolName,ctors[i].size);
		}

		return parser.parseTemplate(ctorTemplate,{
			{ "%ctorTable%",		Global.symbolTable.getUniqueLabelName().string() },
			{ "%ctorTableSize%",	tfm::format("%d",ctors.size()*8) },
			{ "%outerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%innerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%stubName%",		Global.symbolTable.getUniqueLabelName().string() },
			{ "%simpleMode%",		simpleMode ? "1" : "0" },
			{ "%ctorContent%",		table },
		});
	} else {
		return parser.parseTemplate("bx r14");
	}
}